

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::Run(Benchmark *this)

{
  int *piVar1;
  size_t __n;
  int iVar2;
  char *pcVar3;
  DBState state;
  Order order;
  bool write_sync;
  int value_size;
  int *piVar4;
  int entries_per_batch;
  Slice local_60 [3];
  
  PrintHeader(this);
  Open(this);
  piVar1 = (int *)FLAGS_benchmarks;
joined_r0x00105f8a:
  if (piVar1 == (int *)0x0) {
    return;
  }
  pcVar3 = strchr((char *)piVar1,0x2c);
  local_60[0].data_ = "";
  local_60[0].size_ = 0;
  if (pcVar3 == (char *)0x0) {
    local_60[0].size_ = strlen((char *)piVar1);
    piVar4 = (int *)0x0;
  }
  else {
    local_60[0].size_ = (long)pcVar3 - (long)piVar1;
    piVar4 = (int *)(pcVar3 + 1);
  }
  this->bytes_ = 0;
  local_60[0].data_ = (char *)piVar1;
  Start(this);
  __n = local_60[0].size_;
  pcVar3 = local_60[0].data_;
  piVar1 = piVar4;
  switch(local_60[0].size_) {
  case 0:
    iVar2 = bcmp(local_60[0].data_,"",local_60[0].size_);
    if (iVar2 == 0) goto joined_r0x00105f8a;
    break;
  case 7:
    if (*(int *)((long)local_60[0].data_ + 3) == 0x7165736c &&
        *(int *)local_60[0].data_ == 0x6c6c6966) {
      iVar2 = this->num_;
      entries_per_batch = 1;
LAB_001062f2:
      order = SEQUENTIAL;
LAB_001062f9:
      write_sync = false;
      state = FRESH;
      value_size = FLAGS_value_size;
      goto LAB_00106333;
    }
    iVar2 = bcmp(local_60[0].data_,"readseq",local_60[0].size_);
    if (iVar2 != 0) break;
    ReadSequential(this);
    goto LAB_00106355;
  case 9:
    iVar2 = bcmp(local_60[0].data_,"overwrite",local_60[0].size_);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      entries_per_batch = 1;
LAB_0010616b:
      write_sync = false;
      order = RANDOM;
      state = EXISTING;
      value_size = FLAGS_value_size;
      goto LAB_00106333;
    }
    break;
  case 10:
    iVar2 = bcmp(local_60[0].data_,"fillrandom",local_60[0].size_);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      entries_per_batch = 1;
LAB_001062c0:
      order = RANDOM;
      goto LAB_001062f9;
    }
    iVar2 = bcmp(pcVar3,"readrandom",__n);
    if (iVar2 == 0) {
      Read(this,RANDOM,1);
      goto LAB_00106355;
    }
    break;
  case 0xb:
    iVar2 = bcmp(local_60[0].data_,"fillseqsync",local_60[0].size_);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      order = SEQUENTIAL;
LAB_00106331:
      iVar2 = iVar2 / 100;
      entries_per_batch = 1;
      write_sync = true;
      state = FRESH;
      value_size = FLAGS_value_size;
    }
    else {
      iVar2 = bcmp(pcVar3,"fillseq100K",__n);
      if (iVar2 != 0) break;
      iVar2 = this->num_;
      order = SEQUENTIAL;
LAB_00106085:
      iVar2 = iVar2 / 1000;
      entries_per_batch = 1;
      write_sync = false;
      state = FRESH;
      value_size = 100000;
    }
LAB_00106333:
    Write(this,write_sync,order,state,iVar2,value_size,entries_per_batch);
    if (FLAGS_WAL_enabled == true) {
      sqlite3_wal_checkpoint_v2(this->db_,0,1,0,0);
    }
LAB_00106355:
    Stop(this,local_60);
    goto joined_r0x00105f8a;
  case 0xc:
    iVar2 = bcmp(local_60[0].data_,"fillseqbatch",local_60[0].size_);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      entries_per_batch = 1000;
      goto LAB_001062f2;
    }
    iVar2 = bcmp(pcVar3,"fillrandsync",__n);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      order = RANDOM;
      goto LAB_00106331;
    }
    iVar2 = bcmp(pcVar3,"fillrand100K",__n);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      order = RANDOM;
      goto LAB_00106085;
    }
    iVar2 = bcmp(pcVar3,"readrand100K",__n);
    if (iVar2 == 0) {
      iVar2 = this->reads_;
      this->reads_ = iVar2 / 1000;
      Read(this,RANDOM,1);
      this->reads_ = iVar2;
      goto LAB_00106355;
    }
    break;
  case 0xd:
    iVar2 = bcmp(local_60[0].data_,"fillrandbatch",local_60[0].size_);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      entries_per_batch = 1000;
      goto LAB_001062c0;
    }
    break;
  case 0xe:
    iVar2 = bcmp(local_60[0].data_,"overwritebatch",local_60[0].size_);
    if (iVar2 == 0) {
      iVar2 = this->num_;
      entries_per_batch = 1000;
      goto LAB_0010616b;
    }
  }
  Run();
  goto joined_r0x00105f8a;
}

Assistant:

void Run() {
    PrintHeader();
    Open();

    const char* benchmarks = FLAGS_benchmarks;
    while (benchmarks != nullptr) {
      const char* sep = strchr(benchmarks, ',');
      Slice name;
      if (sep == nullptr) {
        name = benchmarks;
        benchmarks = nullptr;
      } else {
        name = Slice(benchmarks, sep - benchmarks);
        benchmarks = sep + 1;
      }

      bytes_ = 0;
      Start();

      bool known = true;
      bool write_sync = false;
      if (name == Slice("fillseq")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqbatch")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandom")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandbatch")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("overwrite")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("overwritebatch")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandsync")) {
        write_sync = true;
        Write(write_sync, RANDOM, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqsync")) {
        write_sync = true;
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrand100K")) {
        Write(write_sync, RANDOM, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseq100K")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("readseq")) {
        ReadSequential();
      } else if (name == Slice("readrandom")) {
        Read(RANDOM, 1);
      } else if (name == Slice("readrand100K")) {
        int n = reads_;
        reads_ /= 1000;
        Read(RANDOM, 1);
        reads_ = n;
      } else {
        known = false;
        if (name != Slice()) {  // No error message for empty name
          std::fprintf(stderr, "unknown benchmark '%s'\n",
                       name.ToString().c_str());
        }
      }
      if (known) {
        Stop(name);
      }
    }
  }